

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ref_clump.c
# Opt level: O3

REF_STATUS ref_clump_tet_quality(REF_GRID_conflict ref_grid,REF_DBL min_quality,char *filename)

{
  REF_NODE pRVar1;
  REF_CELL ref_cell;
  REF_DBL *pRVar2;
  REF_DICT pRVar3;
  uint uVar4;
  REF_STATUS RVar5;
  FILE *__s;
  undefined8 uVar6;
  ulong uVar7;
  char *pcVar8;
  long lVar9;
  int cell;
  long lVar10;
  REF_INT local;
  REF_DICT ref_dict;
  REF_DBL quality;
  REF_INT nodes_1 [27];
  REF_INT nodes [27];
  REF_DICT local_148;
  int local_13c;
  REF_DICT local_138;
  REF_NODE local_130;
  REF_DBL local_128;
  double local_120;
  REF_INT local_118 [28];
  REF_INT local_a8 [30];
  
  pRVar1 = ref_grid->node;
  local_128 = min_quality;
  uVar4 = ref_dict_create(&local_138);
  if (uVar4 == 0) {
    ref_cell = ref_grid->cell[8];
    local_130 = pRVar1;
    if (0 < ref_cell->max) {
      cell = 0;
      do {
        RVar5 = ref_cell_nodes(ref_cell,cell,local_a8);
        if (RVar5 == 0) {
          uVar4 = ref_node_tet_quality(local_130,local_a8,&local_120);
          if (uVar4 != 0) {
            pcVar8 = "qual";
            uVar6 = 0x22d;
            goto LAB_001fe7d8;
          }
          if ((local_120 < local_128) && (uVar4 = ref_dict_store(local_138,cell,0), uVar4 != 0)) {
            pcVar8 = "store";
            uVar6 = 0x22e;
            goto LAB_001fe7d8;
          }
        }
        cell = cell + 1;
      } while (cell < ref_cell->max);
    }
    __s = fopen(filename,"w");
    if (__s == (FILE *)0x0) {
      printf("unable to open %s\n",filename);
      printf("%s: %d: %s: %s\n",
             "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_clump.c",0x233
             ,"ref_clump_tet_quality","unable to open file");
      return 2;
    }
    fwrite("title=\"tecplot refine cell clump file\"\n",0x27,1,__s);
    fwrite("variables = \"x\" \"y\" \"z\"\n",0x18,1,__s);
    pRVar3 = local_138;
    if (0 < local_138->n) {
      uVar4 = ref_dict_create(&local_148);
      if (uVar4 != 0) {
        pcVar8 = "create cell dict";
        uVar6 = 0x5a;
LAB_001feb9e:
        printf("%s: %d: %s: %d %s\n",
               "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_clump.c",
               uVar6,"ref_clump_cell_zone",(ulong)uVar4,pcVar8);
        pcVar8 = "zone";
        uVar6 = 0x239;
        goto LAB_001fe7d8;
      }
      uVar7 = (ulong)(uint)pRVar3->n;
      if (0 < pRVar3->n) {
        lVar10 = 0;
        do {
          uVar4 = ref_cell_nodes(ref_cell,pRVar3->key[lVar10],local_118);
          if (uVar4 != 0) {
            pcVar8 = "n";
            uVar6 = 0x5d;
            goto LAB_001feb9e;
          }
          if (0 < ref_cell->node_per) {
            lVar9 = 0;
            do {
              uVar4 = ref_dict_store(local_148,local_118[lVar9],0);
              if (uVar4 != 0) {
                pcVar8 = "store";
                uVar6 = 0x5f;
                goto LAB_001feb9e;
              }
              lVar9 = lVar9 + 1;
            } while (lVar9 < ref_cell->node_per);
          }
          lVar10 = lVar10 + 1;
          uVar7 = (ulong)pRVar3->n;
        } while (lVar10 < (long)uVar7);
      }
      fprintf(__s,"zone t=\"%s\", nodes=%d, elements=%d, datapacking=%s, zonetype=%s\n",
              "fetetrahedron",(ulong)(uint)local_148->n,uVar7,"point","fetetrahedron");
      pRVar1 = local_130;
      if (0 < local_148->n) {
        lVar10 = 0;
        do {
          local_13c = local_148->key[lVar10];
          lVar9 = (long)local_13c;
          pRVar2 = pRVar1->real;
          fprintf(__s," %.16e %.16e %.16e\n",pRVar2[lVar9 * 0xf],pRVar2[lVar9 * 0xf + 1],
                  pRVar2[lVar9 * 0xf + 2]);
          lVar10 = lVar10 + 1;
        } while (lVar10 < local_148->n);
      }
      if (0 < pRVar3->n) {
        lVar10 = 0;
        do {
          uVar4 = ref_cell_nodes(ref_cell,pRVar3->key[lVar10],local_118);
          if (uVar4 != 0) {
            pcVar8 = "n";
            uVar6 = 0x6f;
            goto LAB_001feb9e;
          }
          if (0 < ref_cell->node_per) {
            lVar9 = 0;
            do {
              uVar4 = ref_dict_location(local_148,local_118[lVar9],&local_13c);
              if (uVar4 != 0) {
                pcVar8 = "ret";
                uVar6 = 0x71;
                goto LAB_001feb9e;
              }
              fprintf(__s," %d",(ulong)(local_13c + 1));
              lVar9 = lVar9 + 1;
            } while (lVar9 < ref_cell->node_per);
          }
          fputc(10,__s);
          lVar10 = lVar10 + 1;
        } while (lVar10 < pRVar3->n);
      }
    }
    fclose(__s);
    uVar4 = ref_dict_free(local_138);
    if (uVar4 == 0) {
      return 0;
    }
    pcVar8 = "free tet";
    uVar6 = 0x23d;
  }
  else {
    pcVar8 = "create cell dict";
    uVar6 = 0x229;
  }
LAB_001fe7d8:
  printf("%s: %d: %s: %d %s\n",
         "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_clump.c",uVar6,
         "ref_clump_tet_quality",(ulong)uVar4,pcVar8);
  return uVar4;
}

Assistant:

REF_FCN REF_STATUS ref_clump_tet_quality(REF_GRID ref_grid, REF_DBL min_quality,
                                         const char *filename) {
  REF_DICT ref_dict;
  REF_NODE ref_node = ref_grid_node(ref_grid);
  REF_CELL ref_cell;
  REF_INT cell;
  REF_INT nodes[REF_CELL_MAX_SIZE_PER];
  REF_DBL quality;
  const char *zonetype;
  FILE *f;

  RSS(ref_dict_create(&ref_dict), "create cell dict");

  ref_cell = ref_grid_tet(ref_grid);
  each_ref_cell_valid_cell_with_nodes(ref_cell, cell, nodes) {
    RSS(ref_node_tet_quality(ref_node, nodes, &quality), "qual");
    if (quality < min_quality) RSS(ref_dict_store(ref_dict, cell, 0), "store");
  }

  f = fopen(filename, "w");
  if (NULL == (void *)f) printf("unable to open %s\n", filename);
  RNS(f, "unable to open file");

  fprintf(f, "title=\"tecplot refine cell clump file\"\n");
  fprintf(f, "variables = \"x\" \"y\" \"z\"\n");

  zonetype = "fetetrahedron";
  RSS(ref_clump_cell_zone(f, ref_cell, ref_dict, zonetype, ref_node), "zone");

  fclose(f);

  RSS(ref_dict_free(ref_dict), "free tet");

  return REF_SUCCESS;
}